

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flag.cc
# Opt level: O3

unique_ptr<absl::lts_20240722::flags_internal::FlagStateInterface,_std::default_delete<absl::lts_20240722::flags_internal::FlagStateInterface>_>
 __thiscall absl::lts_20240722::flags_internal::FlagImpl::SaveState(FlagImpl *this)

{
  byte bVar1;
  FlagOpFn p_Var2;
  ptr_t pvVar3;
  bool bVar4;
  uint uVar5;
  atomic<long> *paVar6;
  undefined8 *puVar7;
  void *dst;
  atomic<unsigned_long> *src;
  void *size;
  atomic<absl::lts_20240722::flags_internal::MaskedPointer> *paVar8;
  FlagImpl *in_RSI;
  ulong uVar9;
  
  DataGuard(in_RSI);
  absl::lts_20240722::Mutex::Lock();
  bVar1 = in_RSI->field_0x29;
  uVar5 = *(uint *)&in_RSI->field_0x28 >> 1 & 3;
  if (uVar5 < 2) {
    paVar6 = OneWordValue(in_RSI);
    dst = (void *)(paVar6->super___atomic_base<long>)._M_i;
    uVar9 = (in_RSI->seq_lock_).lock_.super___atomic_base<long>._M_i;
    if ((uVar9 & 1) != 0) goto LAB_001052ff;
    puVar7 = (undefined8 *)operator_new(0x28);
  }
  else if (uVar5 == 2) {
    dst = (*in_RSI->op_)(kAlloc,(void *)0x0,(void *)0x0,(void *)0x0);
    src = AtomicBufferValue(in_RSI);
    size = (*in_RSI->op_)(kSizeof,(void *)0x0,(void *)0x0,(void *)0x0);
    bVar4 = SequenceLock::TryRead(&in_RSI->seq_lock_,dst,src,(size_t)size);
    if (!bVar4) {
      __assert_fail("success",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O3/_deps/absl-src/absl/flags/internal/flag.cc"
                    ,0x1bd,
                    "virtual std::unique_ptr<FlagStateInterface> absl::flags_internal::FlagImpl::SaveState()"
                   );
    }
    uVar9 = (in_RSI->seq_lock_).lock_.super___atomic_base<long>._M_i;
    if ((uVar9 & 1) != 0) {
LAB_001052ff:
      __assert_fail("val != kUninitialized && (val & 1) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O3/_deps/absl-src/absl/flags/internal/sequence_lock.h"
                    ,0x7f,"int64_t absl::flags_internal::SequenceLock::ModificationCount() const");
    }
    puVar7 = (undefined8 *)operator_new(0x28);
  }
  else {
    p_Var2 = in_RSI->op_;
    paVar8 = PtrStorage(in_RSI);
    pvVar3 = (paVar8->_M_i).ptr_;
    dst = (*p_Var2)(kAlloc,(void *)0x0,(void *)0x0,(void *)0x0);
    (*p_Var2)(kCopyConstruct,(void *)((ulong)pvVar3 & 0xfffffffffffffffc),dst,(void *)0x0);
    uVar9 = (in_RSI->seq_lock_).lock_.super___atomic_base<long>._M_i;
    if ((uVar9 & 1) != 0) goto LAB_001052ff;
    puVar7 = (undefined8 *)operator_new(0x28);
  }
  *puVar7 = &PTR__FlagState_0010ab30;
  puVar7[1] = in_RSI;
  puVar7[2] = dst;
  *(byte *)(puVar7 + 3) = bVar1 >> 2 & 1;
  *(byte *)((long)puVar7 + 0x19) = bVar1 >> 3 & 1;
  puVar7[4] = (long)uVar9 >> 1;
  *(undefined8 **)this = puVar7;
  absl::lts_20240722::Mutex::Unlock();
  return (__uniq_ptr_data<absl::lts_20240722::flags_internal::FlagStateInterface,_std::default_delete<absl::lts_20240722::flags_internal::FlagStateInterface>,_true,_true>
          )(__uniq_ptr_data<absl::lts_20240722::flags_internal::FlagStateInterface,_std::default_delete<absl::lts_20240722::flags_internal::FlagStateInterface>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<FlagStateInterface> FlagImpl::SaveState() {
  absl::MutexLock l(DataGuard());

  bool modified = modified_;
  bool on_command_line = on_command_line_;
  switch (ValueStorageKind()) {
    case FlagValueStorageKind::kValueAndInitBit:
    case FlagValueStorageKind::kOneWordAtomic: {
      return absl::make_unique<FlagState>(
          *this, OneWordValue().load(std::memory_order_acquire), modified,
          on_command_line, ModificationCount());
    }
    case FlagValueStorageKind::kSequenceLocked: {
      void* cloned = flags_internal::Alloc(op_);
      // Read is guaranteed to be successful because we hold the lock.
      bool success =
          seq_lock_.TryRead(cloned, AtomicBufferValue(), Sizeof(op_));
      assert(success);
      static_cast<void>(success);
      return absl::make_unique<FlagState>(*this, cloned, modified,
                                          on_command_line, ModificationCount());
    }
    case FlagValueStorageKind::kHeapAllocated: {
      return absl::make_unique<FlagState>(
          *this,
          flags_internal::Clone(
              op_, PtrStorage().load(std::memory_order_acquire).Ptr()),
          modified, on_command_line, ModificationCount());
    }
  }
  return nullptr;
}